

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column.h
# Opt level: O0

pair<winmd::reader::InterfaceImpl,_winmd::reader::InterfaceImpl> * __thiscall
winmd::reader::TypeDef::InterfaceImpl
          (pair<winmd::reader::InterfaceImpl,_winmd::reader::InterfaceImpl> *__return_storage_ptr__,
          TypeDef *this)

{
  database *pdVar1;
  char *pcVar2;
  int __c;
  TypeDef *__s;
  int local_14;
  TypeDef *local_10;
  TypeDef *this_local;
  
  __s = this;
  local_10 = this;
  pdVar1 = row_base<winmd::reader::TypeDef>::get_database
                     (&this->super_row_base<winmd::reader::TypeDef>);
  pcVar2 = row_base<winmd::reader::TypeDef>::index
                     (&this->super_row_base<winmd::reader::TypeDef>,(char *)__s,__c);
  local_14 = (int)pcVar2 + 1;
  equal_range<winmd::reader::table<winmd::reader::InterfaceImpl>,unsigned_int,winmd::reader::TypeDef::InterfaceImpl()const::compare>
            (__return_storage_ptr__,(reader *)&pdVar1->InterfaceImpl,&local_14);
  return __return_storage_ptr__;
}

Assistant:

inline auto TypeDef::InterfaceImpl() const
    {
        struct compare
        {
            bool operator()(uint32_t const left, reader::InterfaceImpl const& right) noexcept
            {
                return left < right.get_value<uint32_t>(0);
            }

            bool operator()(reader::InterfaceImpl const& left, uint32_t const right) noexcept
            {
                return left.get_value<uint32_t>(0) < right;
            }
        };

        return equal_range(get_database().InterfaceImpl, index() + 1, compare{});
    }